

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O1

uint32_t __thiscall pm::Random::integer(Random *this,uint32_t min,uint32_t max)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  
  uVar3 = max - min;
  if (min <= max) {
    uVar6 = this->state_;
    uVar2 = (ulong)-uVar3 % (ulong)uVar3;
    do {
      uVar4 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
      bVar1 = (byte)(uVar6 >> 0x3b);
      uVar5 = uVar4 >> bVar1 | uVar4 << 0x20 - bVar1;
      uVar4 = (uint)((ulong)-uVar3 % (ulong)uVar3);
      if (uVar4 <= uVar5) {
        uVar2 = (ulong)uVar5 % (ulong)uVar3;
      }
      uVar6 = uVar6 * 0x5851f42d4c957f2d + this->increment_;
    } while (uVar5 < uVar4);
    this->state_ = uVar6;
    return (int)uVar2 + min;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/encelo[P]pmTracer/src/Random.cpp"
                ,0x3d,"uint32_t pm::Random::integer(uint32_t, uint32_t)");
}

Assistant:

uint32_t Random::integer(uint32_t min, uint32_t max)
{
	assert(min <= max);
	return min + boundRandom(state_, increment_, max - min);
}